

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcodec_service.c
# Opt level: O2

char * mpp_get_platform_dev_name(MppCtxType type,MppCodingType coding,RK_U32 platform)

{
  char *pcVar1;
  char **dev;
  RK_U32 RStack_8;
  
  if ((type == MPP_CTX_DEC && (platform >> 9 & 1) != 0) &&
     ((((coding == MPP_VIDEO_CodingAVC || (coding == MPP_VIDEO_CodingVP9)) ||
       (coding == MPP_VIDEO_CodingAVS2)) || (coding == MPP_VIDEO_CodingHEVC)))) {
    dev = mpp_rkvdec_dev;
  }
  else {
    if (((coding == MPP_VIDEO_CodingHEVC) && (type == MPP_CTX_DEC)) && ((platform & 0x100) != 0)) {
      dev = mpp_hevc_dev;
LAB_00121f5f:
      RStack_8 = 3;
      goto LAB_00121fbb;
    }
    if (((type == MPP_CTX_DEC) && (coding == MPP_VIDEO_CodingAVS)) && ((platform & 0x1000) != 0)) {
      dev = mpp_avsd_dev;
    }
    else if (((type == MPP_CTX_ENC) && (coding == MPP_VIDEO_CodingAVC)) &&
            ((platform & 0x10000) != 0)) {
      dev = mpp_rkvenc_dev;
    }
    else {
      if (((coding != MPP_VIDEO_CodingHEVC) || (type != MPP_CTX_ENC)) ||
         ((platform & 0x1000000) == 0)) {
        if (type == MPP_CTX_ENC) {
          pcVar1 = _mpp_find_device(mpp_vepu_dev,2);
          if (pcVar1 != (char *)0x0) {
            return pcVar1;
          }
        }
        dev = mpp_vpu_dev;
        goto LAB_00121f5f;
      }
      dev = mpp_h265e_dev;
    }
  }
  RStack_8 = 2;
LAB_00121fbb:
  pcVar1 = _mpp_find_device(dev,RStack_8);
  return pcVar1;
}

Assistant:

const char *mpp_get_platform_dev_name(MppCtxType type, MppCodingType coding, RK_U32 platform)
{
    const char *dev = NULL;

    if ((platform & HAVE_RKVDEC) && (type == MPP_CTX_DEC) &&
        (coding == MPP_VIDEO_CodingAVC ||
         coding == MPP_VIDEO_CodingHEVC ||
         coding == MPP_VIDEO_CodingAVS2 ||
         coding == MPP_VIDEO_CodingVP9)) {
        dev = mpp_find_device(mpp_rkvdec_dev);
    } else if ((platform & HAVE_HEVC_DEC) && (type == MPP_CTX_DEC) &&
               (coding == MPP_VIDEO_CodingHEVC)) {
        dev = mpp_find_device(mpp_hevc_dev);
    } else if ((platform & HAVE_AVSDEC) && (type == MPP_CTX_DEC) &&
               (coding == MPP_VIDEO_CodingAVS)) {
        dev = mpp_find_device(mpp_avsd_dev);
    } else if ((platform & HAVE_RKVENC) && (type == MPP_CTX_ENC) &&
               (coding == MPP_VIDEO_CodingAVC)) {
        dev = mpp_find_device(mpp_rkvenc_dev);
    } else if ((platform & HAVE_VEPU22) && (type == MPP_CTX_ENC) &&
               (coding == MPP_VIDEO_CodingHEVC)) {
        dev = mpp_find_device(mpp_h265e_dev);
    } else {
        if (type == MPP_CTX_ENC)
            dev = mpp_find_device(mpp_vepu_dev);

        if (dev == NULL)
            dev = mpp_find_device(mpp_vpu_dev);
    }

    return dev;
}